

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParseFromString(Parser *this,string *input,Message *output)

{
  bool bVar1;
  ErrorCollector *error_collector;
  StringPiece input_00;
  undefined1 local_58 [8];
  ArrayInputStream input_stream;
  char *local_30;
  
  StringPiece::StringPiece<std::allocator<char>>((StringPiece *)&input_stream.position_,input);
  input_00.length_ = (stringpiece_ssize_type)this->error_collector_;
  input_00.ptr_ = local_30;
  bVar1 = anon_unknown_20::CheckParseInputSize(input_00,error_collector);
  if (bVar1) {
    io::ArrayInputStream::ArrayInputStream
              ((ArrayInputStream *)local_58,(input->_M_dataplus)._M_p,(int)input->_M_string_length,
               -1);
    bVar1 = Parse(this,(ZeroCopyInputStream *)local_58,output);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TextFormat::Parser::ParseFromString(const std::string& input,
                                         Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::ArrayInputStream input_stream(input.data(), input.size());
  return Parse(&input_stream, output);
}